

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

size_t utf8_line_length(utf8_char_t *data)

{
  size_t sVar1;
  utf8_char_t *in_RDI;
  size_t len;
  size_t n;
  size_t local_20;
  utf8_char_t *local_10;
  
  local_20 = 0;
  local_10 = in_RDI;
  while( true ) {
    if (local_10[local_20] == '\0') {
      return local_20;
    }
    sVar1 = _utf8_newline(local_10);
    if (sVar1 != 0) break;
    sVar1 = utf8_char_length(local_10);
    local_10 = local_10 + sVar1;
    local_20 = local_20 + 1;
  }
  return local_20 + sVar1;
}

Assistant:

size_t utf8_line_length(const utf8_char_t* data)
{
    size_t n, len = 0;

    for (len = 0; 0 != data[len]; ++len) {
        if (0 < (n = _utf8_newline(data))) {
            return len + n;
        }

        data += utf8_char_length(data);
    }

    return len;
}